

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O2

UBool enumToU(UConverterMBCSTable *mbcsTable,int8_t *stateProps,int32_t state,uint32_t offset,
             uint32_t value,UConverterEnumToUCallback *callback,void *context,UErrorCode *pErrorCode
             )

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int32_t (*paiVar4) [256];
  UBool UVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined4 in_register_0000000c;
  UErrorCode *pErrorCode_00;
  uint uVar9;
  ulong uVar10;
  uint16_t *context_00;
  UChar32 codePoints [32];
  
  pErrorCode_00 = (UErrorCode *)CONCAT44(in_register_0000000c,offset);
  bVar1 = stateProps[state];
  uVar6 = (bVar1 & 0x38) << 2;
  if (((bVar1 & 0x38) == 0) && (uVar6 = 0, '?' < (char)bVar1)) {
    codePoints[0] = -1;
    uVar6 = 1;
  }
  paiVar4 = mbcsTable->stateTable;
  context_00 = mbcsTable->unicodeCodeUnits;
  uVar10 = (ulong)uVar6;
  uVar6 = 0xffffffff;
  do {
    if ((ulong)((bVar1 & 7) << 5) + 0x20 <= uVar10) {
      return '\x01';
    }
    uVar3 = paiVar4[state][uVar10];
    uVar9 = (uint)uVar10;
    iVar8 = (int)pErrorCode_00;
    if ((int)uVar3 < 0) {
      uVar7 = 0xffffffff;
      switch(uVar3 >> 0x14 & 0xf) {
      case 0:
        uVar7 = uVar3 & 0xffff;
        break;
      case 1:
        uVar7 = (uVar3 & 0xfffff) + 0x10000;
        break;
      case 4:
        uVar7 = (uint)context_00[(int)((uVar3 & 0xffff) + iVar8)];
        if (0xfffd < uVar7) {
          uVar7 = 0xffffffff;
        }
        break;
      case 5:
        uVar2 = context_00[(int)((uVar3 & 0xffff) + iVar8)];
        uVar7 = (uint)uVar2;
        if (0xd7ff < uVar2) {
          iVar8 = (uVar3 & 0xffff) + iVar8 + 1;
          if (uVar2 < 0xdc00) {
            uVar7 = (uVar2 & 0x3ff) * 0x400 + (uint)context_00[iVar8] + 0x2400;
          }
          else {
            uVar7 = 0xffffffff;
            if (uVar2 == 0xe000) {
              uVar7 = (uint)context_00[iVar8];
            }
          }
        }
      }
      codePoints[uVar9 & 0x1f] = uVar7;
      uVar6 = uVar6 & uVar7;
    }
    else {
      if ((-1 < stateProps[uVar3 >> 0x18]) &&
         (UVar5 = enumToU(mbcsTable,stateProps,uVar3 >> 0x18,(uVar3 & 0xffffff) + iVar8,
                          value << 8 | uVar9,callback,context_00,pErrorCode_00), UVar5 == '\0')) {
        return '\0';
      }
      codePoints[uVar9 & 0x1f] = -1;
    }
    if (((uVar9 + 1 & 0x1f) == 0) && (-1 < (int)uVar6)) {
      UVar5 = writeStage3Roundtrip(callback,uVar9 - 0x1f | value << 8,codePoints);
      uVar6 = 0xffffffff;
      if (UVar5 == '\0') {
        return '\0';
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static UBool
enumToU(UConverterMBCSTable *mbcsTable, int8_t stateProps[],
        int32_t state, uint32_t offset,
        uint32_t value,
        UConverterEnumToUCallback *callback, const void *context,
        UErrorCode *pErrorCode) {
    UChar32 codePoints[32];
    const int32_t *row;
    const uint16_t *unicodeCodeUnits;
    UChar32 anyCodePoints;
    int32_t b, limit;

    row=mbcsTable->stateTable[state];
    unicodeCodeUnits=mbcsTable->unicodeCodeUnits;

    value<<=8;
    anyCodePoints=-1;  /* becomes non-negative if there is a mapping */

    b=(stateProps[state]&0x38)<<2;
    if(b==0 && stateProps[state]>=0x40) {
        /* skip byte sequences with leading zeros because they are not stored in the fromUnicode table */
        codePoints[0]=U_SENTINEL;
        b=1;
    }
    limit=((stateProps[state]&7)+1)<<5;
    while(b<limit) {
        int32_t entry=row[b];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            int32_t nextState=MBCS_ENTRY_TRANSITION_STATE(entry);
            if(stateProps[nextState]>=0) {
                /* recurse to a state with non-ignorable actions */
                if(!enumToU(
                        mbcsTable, stateProps, nextState,
                        offset+MBCS_ENTRY_TRANSITION_OFFSET(entry),
                        value|(uint32_t)b,
                        callback, context,
                        pErrorCode)) {
                    return FALSE;
                }
            }
            codePoints[b&0x1f]=U_SENTINEL;
        } else {
            UChar32 c;
            int32_t action;

            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=MBCS_ENTRY_FINAL_ACTION(entry);
            if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            } else if(action==MBCS_STATE_VALID_16) {
                int32_t finalOffset=offset+MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[finalOffset];
                if(c<0xfffe) {
                    /* output BMP code point */
                } else {
                    c=U_SENTINEL;
                }
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                int32_t finalOffset=offset+MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[finalOffset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                } else if(c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=((c&0x3ff)<<10)+unicodeCodeUnits[finalOffset]+(0x10000-0xdc00);
                } else if(c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[finalOffset];
                } else {
                    c=U_SENTINEL;
                }
            } else if(action==MBCS_STATE_VALID_DIRECT_20) {
                /* output supplementary code point */
                c=(UChar32)(MBCS_ENTRY_FINAL_VALUE(entry)+0x10000);
            } else {
                c=U_SENTINEL;
            }

            codePoints[b&0x1f]=c;
            anyCodePoints&=c;
        }
        if(((++b)&0x1f)==0) {
            if(anyCodePoints>=0) {
                if(!callback(context, value|(uint32_t)(b-0x20), codePoints)) {
                    return FALSE;
                }
                anyCodePoints=-1;
            }
        }
    }
    return TRUE;
}